

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O2

void TestSuite::usage(int argc,char **argv)

{
  putchar(10);
  printf("Usage: %s [-f <keyword>] [-r <parameter>] [-p]\n",*argv);
  putchar(10);
  puts("    -f, --filter");
  puts("        Run specific tests matching the given keyword.");
  puts("    -r, --range");
  puts("        Run TestRange-based tests using given parameter value.");
  puts("    -p, --preserve");
  puts("        Do not clean up test files.");
  puts("    --abort-on-failure");
  puts("        Immediately abort the test if failure happens.");
  puts("    --suppress-msg");
  puts("        Suppress test messages.");
  puts("    --display-msg");
  puts("        Display test messages.");
  putchar(10);
  return;
}

Assistant:

static void usage(int argc, char** argv) {
        printf("\n");
        printf("Usage: %s [-f <keyword>] [-r <parameter>] [-p]\n", argv[0]);
        printf("\n");
        printf("    -f, --filter\n");
        printf("        Run specific tests matching the given keyword.\n");
        printf("    -r, --range\n");
        printf("        Run TestRange-based tests using given parameter value.\n");
        printf("    -p, --preserve\n");
        printf("        Do not clean up test files.\n");
        printf("    --abort-on-failure\n");
        printf("        Immediately abort the test if failure happens.\n");
        printf("    --suppress-msg\n");
        printf("        Suppress test messages.\n");
        printf("    --display-msg\n");
        printf("        Display test messages.\n");
        printf("\n");
    }